

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

_Bool os_direxists(char *filepath)

{
  _Bool _Var1;
  int iVar2;
  uint *puVar3;
  int iVar4;
  stat *__buf;
  stat st;
  stat local_90;
  
  __buf = &local_90;
  iVar2 = stat(filepath,__buf);
  iVar4 = (int)__buf;
  if (iVar2 != -1) {
    return (local_90.st_mode & 0xf000) == 0x4000;
  }
  puVar3 = (uint *)__errno_location();
  if ((*puVar3 < 0x15) && ((0x102004U >> (*puVar3 & 0x1f) & 1) != 0)) {
    return false;
  }
  os_direxists_cold_1();
  if ((iVar4 != 0) && (_Var1 = os_direxists(filepath), _Var1)) {
    return true;
  }
  iVar2 = mkdir(filepath,0x1fd);
  return iVar2 != -1;
}

Assistant:

bool os_direxists(char *filepath) {
    bool result = false;
#if defined(__linux__) || defined(__FreeBSD__) || defined(__OpenBSD__) ||      \
    defined(__NetBSD__) || defined(__DragonFly__)
    struct stat st;
    int stres = stat(filepath, &st);

    if (stres == -1) {
        if (errno == ENOENT || errno == EACCES || errno == ENOTDIR) {
            return false;
        }
        perror("fexists failure");
        exit(EXIT_FAILURE);
    } else {
        if (S_ISDIR(st.st_mode)) {
            return true;
        } else {
            return false;
        }
    }
#elif __APPLE__
#error "TODO os_fexists for APPLE platform"
#else
#error "TODO os_fexists for WINDOWS platform"
#endif

    return result;
}